

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,ScopeFunctor *SetScopes,
          TransitionProbFunctor *ComputeTransitionProb,
          ObservationProbFunctor *ComputeObservationProb)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  long *plVar7;
  ObservationProbFunctor *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RDI;
  undefined8 extraout_XMM0_Qa;
  TwoStageDynamicBayesianNetwork *pTVar8;
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  Index iiI_1;
  double p_1;
  Index oVal;
  bool skipY;
  size_t ii_size2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  CPT *cpt_1;
  size_t ii_size_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrX_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrY_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrA_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrO;
  size_t XSoI_o_size;
  size_t YSoI_o_size;
  size_t ASoI_o_size;
  size_t OSoI_o_size;
  Scope *XSoI_o;
  Scope *YSoI_o;
  Scope *ASoI_o;
  Scope *OSoI_o;
  size_t nrVals_o;
  Index o;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nroVals;
  Index iiI;
  double p;
  Index yVal;
  size_t ii_size2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  CPT *cpt;
  size_t ii_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrY;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrX;
  size_t YSoI_y_size;
  size_t ASoI_y_size;
  size_t XSoI_y_size;
  Scope *YSoI_y;
  Scope *ASoI_y;
  Scope *XSoI_y;
  size_t nrVals_y;
  Index y;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nryVals;
  TwoStageDynamicBayesianNetwork *in_stack_00000510;
  undefined1 *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  undefined1 in_stack_fffffffffffffc38;
  byte in_stack_fffffffffffffc39;
  undefined1 in_stack_fffffffffffffc3a;
  undefined1 in_stack_fffffffffffffc3b;
  Index in_stack_fffffffffffffc3c;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  char *arg;
  E *in_stack_fffffffffffffc50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc58;
  CPT *in_stack_fffffffffffffc60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc70;
  bool local_341;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffcc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd1;
  undefined1 in_stack_fffffffffffffcd2;
  undefined1 in_stack_fffffffffffffcd3;
  Index in_stack_fffffffffffffcd4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffce8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffcf0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffcf8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd00;
  undefined1 *in_stack_fffffffffffffd08;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffd10;
  uint local_2a8;
  size_t local_2a0;
  undefined1 local_295 [37];
  undefined1 local_270 [27];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_255;
  undefined4 local_234;
  undefined1 local_230 [24];
  long *local_218;
  size_t local_210;
  char *local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_198;
  size_type local_190;
  Scope *local_188;
  Scope *local_180;
  Scope *local_178;
  Scope *local_170;
  value_type local_168;
  uint local_15c;
  undefined8 local_158;
  Index local_14c;
  double local_148;
  uint local_13c;
  size_t local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_12d;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_10d;
  undefined1 local_ed;
  undefined4 local_ec;
  undefined1 local_e8 [24];
  TwoStageDynamicBayesianNetwork *local_d0;
  size_t local_c8;
  TwoStageDynamicBayesianNetwork *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  Scope *local_50;
  Scope *local_48;
  Scope *local_40;
  value_type local_38;
  uint local_2c;
  undefined8 local_28;
  ObservationProbFunctor *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TwoStageDynamicBayesianNetwork::InitializeStorage
            ((TwoStageDynamicBayesianNetwork *)
             CONCAT44(in_stack_fffffffffffffcd4,
                      CONCAT13(in_stack_fffffffffffffcd3,
                               CONCAT12(in_stack_fffffffffffffcd2,
                                        CONCAT11(in_stack_fffffffffffffcd1,in_stack_fffffffffffffcd0
                                                )))));
  (**(code **)*local_10)();
  SetConnectionsSpecified(in_RDI,true);
  TwoStageDynamicBayesianNetwork::InitializeIIs(in_stack_00000510);
  local_28 = (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0xb8))();
  for (local_2c = 0; uVar3 = (ulong)local_2c,
      uVar4 = (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0xa8))(),
      uVar3 < uVar4; local_2c = local_2c + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                        (size_type)in_stack_fffffffffffffc18);
    local_38 = *pvVar5;
    local_40 = TwoStageDynamicBayesianNetwork::GetXSoI_Y
                         ((TwoStageDynamicBayesianNetwork *)
                          CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                          (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_48 = TwoStageDynamicBayesianNetwork::GetASoI_Y
                         ((TwoStageDynamicBayesianNetwork *)
                          CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                          (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_50 = TwoStageDynamicBayesianNetwork::GetYSoI_Y
                         ((TwoStageDynamicBayesianNetwork *)
                          CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                          (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40->super_SDT);
    local_60 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_48->super_SDT);
    local_68 = (TwoStageDynamicBayesianNetwork *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_50->super_SDT);
    TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_Y
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_Y
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_Y
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_c8 = TwoStageDynamicBayesianNetwork::GetiiSize_Y
                         (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    in_stack_fffffffffffffd10 = (TwoStageDynamicBayesianNetwork *)operator_new(0x30);
    CPT::CPT(in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,
             (size_t)in_stack_fffffffffffffc50);
    local_ec = 0;
    in_stack_fffffffffffffd08 = &local_ed;
    in_stack_fffffffffffffd00 = local_58;
    local_d0 = in_stack_fffffffffffffd10;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae8a2e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
               CONCAT44(in_stack_fffffffffffffc3c,
                        CONCAT13(in_stack_fffffffffffffc3b,
                                 CONCAT12(in_stack_fffffffffffffc3a,
                                          CONCAT11(in_stack_fffffffffffffc39,
                                                   in_stack_fffffffffffffc38)))),
               (value_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
               ,(allocator_type *)in_stack_fffffffffffffc28);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae8a62);
    local_10d.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = 0;
    in_stack_fffffffffffffcf8 = &local_10d;
    in_stack_fffffffffffffcf0 = local_60;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae8a92);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
               CONCAT44(in_stack_fffffffffffffc3c,
                        CONCAT13(in_stack_fffffffffffffc3b,
                                 CONCAT12(in_stack_fffffffffffffc3a,
                                          CONCAT11(in_stack_fffffffffffffc39,
                                                   in_stack_fffffffffffffc38)))),
               (value_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
               ,(allocator_type *)in_stack_fffffffffffffc28);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae8ac6);
    local_12d.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = 0;
    in_stack_fffffffffffffce8 = &local_12d;
    pTVar8 = local_68;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae8af6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
               CONCAT44(in_stack_fffffffffffffc3c,
                        CONCAT13(in_stack_fffffffffffffc3b,
                                 CONCAT12(in_stack_fffffffffffffc3a,
                                          CONCAT11(in_stack_fffffffffffffc39,
                                                   in_stack_fffffffffffffc38)))),
               (value_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
               ,(allocator_type *)in_stack_fffffffffffffc28);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae8b2a);
    local_138 = 0;
    do {
      local_138 = local_138 + 1;
      for (local_13c = 0; local_13c < local_38; local_13c = local_13c + 1) {
        local_148 = (double)(**(code **)*local_18)
                                      (local_18,local_2c,local_13c,local_e8,
                                       (undefined1 *)
                                       ((long)&local_10d.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 5),
                                       (undefined1 *)
                                       ((long)&local_12d.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 5));
        if (1e-12 < local_148) {
          in_stack_fffffffffffffcd4 =
               TwoStageDynamicBayesianNetwork::IndividualToJointYiiIndices
                         (pTVar8,(Index)((ulong)local_148 >> 0x20),
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffcd4,
                                   CONCAT13(in_stack_fffffffffffffcd3,
                                            CONCAT12(in_stack_fffffffffffffcd2,
                                                     CONCAT11(in_stack_fffffffffffffcd1,
                                                              in_stack_fffffffffffffcd0)))),
                          in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
          local_14c = in_stack_fffffffffffffcd4;
          (*(code *)local_d0->_m_madp[3])(local_148,local_d0,local_13c,in_stack_fffffffffffffcd4);
        }
      }
      in_stack_fffffffffffffcd3 =
           IndexTools::Increment
                     (in_stack_fffffffffffffc58,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffc50);
    } while (((((in_stack_fffffffffffffcd3 ^ 0xff) & 1) != 0) ||
             (in_stack_fffffffffffffcd2 =
                   IndexTools::Increment
                             (in_stack_fffffffffffffc58,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc50),
             ((in_stack_fffffffffffffcd2 ^ 0xff) & 1) != 0)) ||
            (in_stack_fffffffffffffcd1 =
                  IndexTools::Increment
                            (in_stack_fffffffffffffc58,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc50),
            ((in_stack_fffffffffffffcd1 ^ 0xff) & 1) != 0));
    if (local_c8 != local_138) {
      uVar6 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      __cxa_throw(uVar6,&E::typeinfo,E::~E);
    }
    TwoStageDynamicBayesianNetwork::SetCPD_Y
              ((TwoStageDynamicBayesianNetwork *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (Index)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (CPDDiscreteInterface *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20)
              );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  }
  bVar1 = ObservationProbFunctor::isEmpty(local_20);
  if (!bVar1) {
    local_158 = (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x160))();
    local_15c = 0;
    while( true ) {
      uVar3 = (ulong)local_15c;
      uVar4 = (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x10))();
      if (uVar4 <= uVar3) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                          (size_type)in_stack_fffffffffffffc18);
      local_168 = *pvVar5;
      local_170 = TwoStageDynamicBayesianNetwork::GetOSoI_O
                            ((TwoStageDynamicBayesianNetwork *)
                             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                             (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      local_178 = TwoStageDynamicBayesianNetwork::GetASoI_O
                            ((TwoStageDynamicBayesianNetwork *)
                             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                             (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      local_180 = TwoStageDynamicBayesianNetwork::GetYSoI_O
                            ((TwoStageDynamicBayesianNetwork *)
                             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                             (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      local_188 = TwoStageDynamicBayesianNetwork::GetXSoI_O
                            ((TwoStageDynamicBayesianNetwork *)
                             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                             (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      local_190 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&local_170->super_SDT);
      local_198 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&local_178->super_SDT);
      local_1a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&local_180->super_SDT);
      local_1a8 = (char *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    (&local_188->super_SDT);
      bVar2 = (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x1d0))();
      auVar9._8_56_ = extraout_var;
      auVar9._0_8_ = extraout_XMM0_Qa;
      local_341 = (bVar2 & 1) != 0 || local_1a8 != (char *)0x0;
      SetEventObservability(in_RDI,local_341);
      TwoStageDynamicBayesianNetwork::GetNrVals_OSoI_O
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_O
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_O
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_O
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      local_210 = TwoStageDynamicBayesianNetwork::GetiiSize_O
                            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      plVar7 = (long *)operator_new(0x30);
      CPT::CPT(in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,
               (size_t)in_stack_fffffffffffffc50);
      local_234 = 0;
      local_218 = plVar7;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae9287);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
                 CONCAT44(in_stack_fffffffffffffc3c,
                          CONCAT13(in_stack_fffffffffffffc3b,
                                   CONCAT12(in_stack_fffffffffffffc3a,
                                            CONCAT11(in_stack_fffffffffffffc39,
                                                     in_stack_fffffffffffffc38)))),
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (allocator_type *)in_stack_fffffffffffffc28);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae92b5);
      local_255.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._1_4_ = 0;
      in_stack_fffffffffffffc70 = &local_255;
      in_stack_fffffffffffffc68 = local_198;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae92df);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
                 CONCAT44(in_stack_fffffffffffffc3c,
                          CONCAT13(in_stack_fffffffffffffc3b,
                                   CONCAT12(in_stack_fffffffffffffc3a,
                                            CONCAT11(in_stack_fffffffffffffc39,
                                                     in_stack_fffffffffffffc38)))),
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (allocator_type *)in_stack_fffffffffffffc28);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae930d);
      local_295._33_4_ = 0;
      in_stack_fffffffffffffc60 = (CPT *)(local_295 + 0x20);
      in_stack_fffffffffffffc58 = local_1a0;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae9337);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
                 CONCAT44(in_stack_fffffffffffffc3c,
                          CONCAT13(in_stack_fffffffffffffc3b,
                                   CONCAT12(in_stack_fffffffffffffc3a,
                                            CONCAT11(in_stack_fffffffffffffc39,
                                                     in_stack_fffffffffffffc38)))),
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (allocator_type *)in_stack_fffffffffffffc28);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae9365);
      local_295._1_4_ = 0;
      in_stack_fffffffffffffc50 = (E *)local_295;
      arg = local_1a8;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xae938f);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc40,
                 CONCAT44(in_stack_fffffffffffffc3c,
                          CONCAT13(in_stack_fffffffffffffc3b,
                                   CONCAT12(in_stack_fffffffffffffc3a,
                                            CONCAT11(in_stack_fffffffffffffc39,
                                                     in_stack_fffffffffffffc38)))),
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (allocator_type *)in_stack_fffffffffffffc28);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xae93bd);
      local_2a0 = 0;
      do {
        do {
          local_2a0 = local_2a0 + 1;
          for (local_2a8 = 0; pTVar8 = auVar9._0_8_, local_2a8 < local_168;
              local_2a8 = local_2a8 + 1) {
            in_stack_fffffffffffffc18 = local_230;
            (**local_20->_vptr_ObservationProbFunctor)
                      (local_20,(ulong)local_15c,(ulong)local_2a8,local_295 + 5,
                       (undefined1 *)
                       ((long)&local_255.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + 5),local_270);
            in_stack_fffffffffffffc40 = pTVar8;
            in_stack_fffffffffffffc3c =
                 TwoStageDynamicBayesianNetwork::IndividualToJointOiiIndices
                           (in_stack_fffffffffffffd10,
                            (Index)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                            in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                            in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            auVar9 = ZEXT864(pTVar8);
            if (1e-12 < (double)pTVar8) {
              auVar9._0_8_ = (**(code **)(*local_218 + 0x18))
                                       (pTVar8,local_218,local_2a8,in_stack_fffffffffffffc3c);
              auVar9._8_56_ = extraout_var_00;
            }
          }
          in_stack_fffffffffffffc3b =
               IndexTools::Increment
                         (in_stack_fffffffffffffc58,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc50);
        } while ((((in_stack_fffffffffffffc3b ^ 0xff) & 1) != 0) ||
                (in_stack_fffffffffffffc3a =
                      IndexTools::Increment
                                (in_stack_fffffffffffffc58,
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffffc50),
                ((in_stack_fffffffffffffc3a ^ 0xff) & 1) != 0));
        in_stack_fffffffffffffc39 = 0;
        if ((in_RDI->_m_eventObservability & 1U) != 0) {
          in_stack_fffffffffffffc38 =
               IndexTools::Increment
                         (in_stack_fffffffffffffc58,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc50);
          in_stack_fffffffffffffc39 = in_stack_fffffffffffffc38 ^ 0xff;
        }
      } while (((in_stack_fffffffffffffc39 & 1) != 0) ||
              (in_stack_fffffffffffffc37 =
                    IndexTools::Increment
                              (in_stack_fffffffffffffc58,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffc50),
              ((in_stack_fffffffffffffc37 ^ 0xff) & 1) != 0));
      if (local_210 != local_2a0) {
        uVar6 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffffc50,arg);
        __cxa_throw(uVar6,&E::typeinfo,E::~E);
      }
      TwoStageDynamicBayesianNetwork::SetCPD_O
                ((TwoStageDynamicBayesianNetwork *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (Index)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                 (CPDDiscreteInterface *)
                 CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
      local_15c = local_15c + 1;
    }
  }
  SetInitialized(in_stack_fffffffffffffc28,(bool)in_stack_fffffffffffffc27);
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(ScopeFunctor& SetScopes,
                                                                     TransitionProbFunctor& ComputeTransitionProb,
                                                                     ObservationProbFunctor& ComputeObservationProb)
{
//Initialize storage in the 2DBN
    _m_2dbn.InitializeStorage(); 
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates: 2DBN storage initialized"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif
    SetScopes();
    SetConnectionsSpecified(true);
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates::scopes set and thus all connections specified"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif

//initialize II meta-information
    _m_2dbn.InitializeIIs();

    const vector<size_t>& nryVals = GetNrValuesPerFactor();
//Create Transition model
#if DEBUG_2DBN
    if(DEBUG_2DBN) cout << ">>>Adding Transition model..."<<endl;
#endif
    //For each state factor, we create the CPT here
    for(Index y=0; y< GetNrStateFactors(); y++)
    {
#if DEBUG_2DBN
        cout << "Creating CPT for sfI=" << GetStateFactorDiscrete(y)->GetName() << endl;
#endif
        //1)determine the SoI(y)
        //2)allocate the CPT
        //3)fill it up
        //4)attach it to 2BDN
        
        //determine the SoI(y)
        size_t nrVals_y = nryVals.at(y);
        const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(y);
        const Scope& ASoI_y = _m_2dbn.GetASoI_Y(y);
        const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(y);
        size_t XSoI_y_size = XSoI_y.size();
        size_t ASoI_y_size = ASoI_y.size();
        size_t YSoI_y_size = YSoI_y.size();
        
        vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_Y(y);
        vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_Y(y);
        vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_Y(y);

        size_t ii_size = _m_2dbn.GetiiSize_Y(y);

        //2)allocate the CPT
        CPT* cpt = new CPT(nrVals_y, ii_size);

        //3)fill it up
        vector<Index> Xs(XSoI_y_size, 0 );
        vector<Index> As(ASoI_y_size, 0 );
        vector<Index> Ys(YSoI_y_size, 0 );
        size_t ii_size2=0;
#if DEBUG_2DBN
        cout << "starting loop through Xs of size " << XSoI_y_size << endl;
#endif
        do{
#if DEBUG_2DBN
          //            cout << SoftPrintVector(Xs) << " - PS state is " <<
          //      SoftPrintPartialState(XSoI_y, Xs) << endl;
#endif
            do{
#if DEBUG_2DBN
                cout << "\ta="<< SoftPrintVector(As) << " (scope="<<
                    ASoI_y <<")" << endl;
#endif
                do{
#if DEBUG_2DBN
                    cout << "\t\t";// << SoftPrintVector(Ys);
#endif
                    ii_size2++;
                    for(Index yVal=0; yVal < nrVals_y; yVal++)
                    {
                        //compute P(y = yVal | ii=<Xs, As, Ys>) :
                        double p = ComputeTransitionProb(y, yVal, Xs,As,Ys);
                        
                        if(p > Globals::PROB_PRECISION)
                        {
#if DEBUG_2DBN
                            cout << "P("<<GetStateFactorDiscrete(y)->GetName()<<":"<<GetStateFactorDiscrete(y)->GetStateFactorValue(yVal)<<"|...)=";
                            printf("%.3f, ", p);
#endif
                            Index iiI = _m_2dbn.IndividualToJointYiiIndices(
                                y, Xs, As, Ys);
                            cpt->Set(yVal, iiI, p);
                        }
                    }
#if DEBUG_2DBN
                    cout << endl;
#endif

                } while(! IndexTools::Increment( Ys, r_nrY ) ); 

            } while(! IndexTools::Increment( As, r_nrA ) ); 

        } while(! IndexTools::Increment( Xs, r_nrX ) ); 
        //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
        if (ii_size != ii_size2 )
            throw E("ii_size != ii_size2 ");

        //4)attach it to 2BDN
        _m_2dbn.SetCPD_Y(y, cpt);
    }//end (for y)

    //Only continue if an initialization function for observation probabilities is given
    if(!ComputeObservationProb.isEmpty())
    {
        const vector<size_t>& nroVals = GetNrObservations();
//Create the observation model    
#if DEBUG_2DBN
        cout << ">>>Adding Observation model..."<<endl;
#endif
        //For each observation, we create the CPT here
        for(Index o=0; o < GetNrAgents(); o++)
        {
#if DEBUG_2DBN
            cout << "Creating CPT for oI (i.e., agentI)=" << o << endl;
#endif
            //1)determine the SoI(o)
            //2)allocate the CPT
            //3)fill it up
            //4)attach it to 2BDN
        
            //determine the SoI(o)
            size_t nrVals_o = nroVals.at(o);
            const Scope& OSoI_o = _m_2dbn.GetOSoI_O(o);
            const Scope& ASoI_o = _m_2dbn.GetASoI_O(o);
            const Scope& YSoI_o = _m_2dbn.GetYSoI_O(o);
            const Scope& XSoI_o = _m_2dbn.GetXSoI_O(o);
            size_t OSoI_o_size = OSoI_o.size();
            size_t ASoI_o_size = ASoI_o.size();
            size_t YSoI_o_size = YSoI_o.size();
            size_t XSoI_o_size = XSoI_o.size();
            
            SetEventObservability(GetEventObservability() || XSoI_o_size > 0); //if true, we use O(o,s,a,s') instead of O(o,a,s')
            
            vector<size_t> r_nrO = _m_2dbn.GetNrVals_OSoI_O(o);
            vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_O(o);
            vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_O(o);
            vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_O(o);
            
            size_t ii_size = _m_2dbn.GetiiSize_O(o);
            
            //2)allocate the CPT
            CPT* cpt = new CPT(nrVals_o, ii_size);
            
            //3)fill it up
            vector<Index> Os(OSoI_o_size, 0 );
            vector<Index> As(ASoI_o_size, 0 );
            vector<Index> Ys(YSoI_o_size, 0 );
            vector<Index> Xs(XSoI_o_size, 0 );
            size_t ii_size2=0;
#if DEBUG_2DBN
            cout << "starting loop through Os of size " << OSoI_o_size << endl;
#endif
            do{
                do{
#if DEBUG_2DBN
                    cout << SoftPrintVector(As)<<endl;
#endif
                    do{
                        bool skipY = false;
#if SKIP_IMPOSSIBLE_EVENTS
                        if(_m_eventObservability){
                          for(Index i = 0; i < YSoI_o_size; i++){
                              const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(YSoI_o[i]);
                              const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(YSoI_o[i]);
                              const Scope& ASoI_y = _m_2dbn.GetASoI_Y(YSoI_o[i]);
                              Scope Y;
                              if(XSoI_y.IsSubSetOf(XSoI_o) &&
                                 YSoI_y.IsSubSetOf(YSoI_o) &&
                                 ASoI_y.IsSubSetOf(ASoI_o)){ //I have enough information to know if these transitions are possible
                                Y.Insert(YSoI_o[i]);
                                vector<Index> yVal(1,Ys[YSoI_o[i]]);
                                if(_m_2dbn.GetYProbabilityGeneral(XSoI_o,Xs,
                                                                  ASoI_o,As,
                                                                  YSoI_o,Ys,
                                                                  Y,yVal) <= Globals::PROB_PRECISION){
                                  skipY = true;
                                  break;
                                }                              
                              }
                          }
                        }
#endif
#if DEBUG_2DBN
                  //                    cout << "\t" << SoftPrintVector(Ys) << " - NS state is " <<
                  //        SoftPrintPartialState(YSoI_o, Ys) << endl;
#endif
                        do{
#if DEBUG_2DBN
                          cout << "\t\t";// << SoftPrintVector(Os) //<-empty
#endif
                          ii_size2++;
                          for(Index oVal=0; oVal < nrVals_o; oVal++)
                            {
                              //compute P(o=oVal | ii=<Os, [Xs], As, Ys>) :
                              double p;
                              if(!skipY){
                                p = ComputeObservationProb(o, oVal, Xs, As, Ys, Os);
                              }else{
                                p = 1.0/(float) nrVals_o;
                              }
#if DEBUG_2DBN
                              cout << "P(o="<<oVal<<"|...)=";
                              printf("%.3f, ", p);
#endif
                              Index iiI = _m_2dbn.IndividualToJointOiiIndices(o, Xs, As, Ys, Os);
                              if(p > Globals::PROB_PRECISION)
                                cpt->Set(oVal, iiI, p);
                            }
#if DEBUG_2DBN
                          cout << endl;
#endif
                        } while(! IndexTools::Increment( Os, r_nrO ) ); 
                   
                    } while(! IndexTools::Increment( Ys, r_nrY ) ); 
                
                } while(_m_eventObservability && !IndexTools::Increment( Xs, r_nrX ) ); 
           
            } while(! IndexTools::Increment( As, r_nrA ) ); 
                
            //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
            if (ii_size != ii_size2 )
                throw E("ii_size != ii_size2 ");
            
            //4)attach it to 2BDN
            _m_2dbn.SetCPD_O(o, cpt);
        }//end (for o)

    } else {
#if DEBUG_2DBN
        cout << ">>>Skipping addition of Observation model CPTs." << endl;
#endif
    }
    
    SetInitialized(true);
}